

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelBufferDataStoreCase::init
          (TextureLevelBufferDataStoreCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  NotSupportedError *this_01;
  char *ctx_00;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  TextureLevelBufferDataStoreCase *local_10;
  TextureLevelBufferDataStoreCase *this_local;
  
  local_10 = this;
  this_00 = gles31::Context::getContextInfo((this->super_TextureLevelCase).super_TestCase.m_context)
  ;
  ctx_00 = "GL_EXT_texture_buffer";
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
  if (!bVar1) {
    pRVar3 = gles31::Context::getRenderContext
                       ((this->super_TextureLevelCase).super_TestCase.m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    ctx_00 = (char *)(ulong)local_18;
    bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires GL_EXT_texture_buffer extension",&local_39);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  iVar2 = TextureLevelCase::init(&this->super_TextureLevelCase,(EVP_PKEY_CTX *)ctx_00);
  return iVar2;
}

Assistant:

void init (void)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer") &&
			!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			throw tcu::NotSupportedError("Test requires GL_EXT_texture_buffer extension");
		TextureLevelCase::init();
	}